

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O1

bool __thiscall
QWidgetTextControlPrivate::dragMoveEvent
          (QWidgetTextControlPrivate *this,QEvent *e,QMimeData *mimeData,QPointF *pos)

{
  QTextCursor *cursor;
  QObject *this_00;
  char cVar1;
  MoveMode MVar2;
  bool bVar3;
  long in_FS_OFFSET;
  QRectF local_78;
  QRectF local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->interactionFlags).super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
       super_QFlagsStorage<Qt::TextInteractionFlag>.i & 0x10) != 0) {
    this_00 = *(QObject **)&this->field_0x8;
    cVar1 = (**(code **)(*(long *)this_00 + 0xa0))(this_00,mimeData);
    if (cVar1 != '\0') {
      MVar2 = (**(code **)(*(long *)this_00 + 0x78))(this_00,pos,1);
      bVar3 = true;
      if (MVar2 != ~MoveAnchor) {
        cursor = &this->dndFeedbackCursor;
        local_78.w = -NAN;
        local_78.h = -NAN;
        local_78.xp = -NAN;
        local_78.yp = -NAN;
        QWidgetTextControl::cursorRect(&local_78,(QWidgetTextControl *)this_00,cursor);
        if ((0.0 < local_78.w) && (0.0 < local_78.h)) {
          local_58.xp = 0.0;
          local_58.yp = (qreal)&local_78;
          QMetaObject::activate(this_00,&QWidgetTextControl::staticMetaObject,7,(void **)&local_58);
        }
        QTextCursor::operator=(cursor,&this->cursor);
        QTextCursor::setPosition((int)cursor,MVar2);
        QWidgetTextControl::cursorRect(&local_58,(QWidgetTextControl *)this_00,cursor);
        local_78.w = local_58.w;
        local_78.h = local_58.h;
        local_78.xp = local_58.xp;
        local_78.yp = local_58.yp;
        local_58.xp = 0.0;
        local_58.yp = (qreal)&local_78;
        QMetaObject::activate(this_00,&QWidgetTextControl::staticMetaObject,7,(void **)&local_58);
      }
      goto LAB_004cba75;
    }
  }
  e[0xc] = (QEvent)0x0;
  bVar3 = false;
LAB_004cba75:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QWidgetTextControlPrivate::dragMoveEvent(QEvent *e, const QMimeData *mimeData, const QPointF &pos)
{
    Q_Q(QWidgetTextControl);
    if (!(interactionFlags & Qt::TextEditable) || !q->canInsertFromMimeData(mimeData)) {
        e->ignore();
        return false;
    }

    const int cursorPos = q->hitTest(pos, Qt::FuzzyHit);
    if (cursorPos != -1) {
        QRectF crect = q->cursorRect(dndFeedbackCursor);
        if (crect.isValid())
            emit q->updateRequest(crect);

        dndFeedbackCursor = cursor;
        dndFeedbackCursor.setPosition(cursorPos);

        crect = q->cursorRect(dndFeedbackCursor);
        emit q->updateRequest(crect);
    }

    return true; // accept proposed action
}